

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Fx_ManCreateDivisors(Fx_Man_t *p)

{
  size_t __size;
  uint in_EAX;
  uint uVar1;
  Hsh_VecMan_t *pHVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Flt_t *pVVar5;
  float *pfVar6;
  Vec_Wec_t *pVVar7;
  Vec_Que_t *pVVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int fWarning;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  if (p->pHash != (Hsh_VecMan_t *)0x0) {
    __assert_fail("p->pHash == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0x36d,"void Fx_ManCreateDivisors(Fx_Man_t *)");
  }
  pHVar2 = (Hsh_VecMan_t *)calloc(1,0x28);
  uVar12 = 999;
  while( true ) {
    do {
      uVar11 = uVar12;
      uVar12 = uVar11 + 1;
    } while ((uVar11 & 1) != 0);
    if (uVar12 < 9) break;
    iVar10 = 5;
    while (uVar12 % (iVar10 - 2U) != 0) {
      uVar1 = iVar10 * iVar10;
      iVar10 = iVar10 + 2;
      if (uVar12 < uVar1) goto LAB_0025c80a;
    }
  }
LAB_0025c80a:
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar11) {
    uVar1 = uVar12;
  }
  pVVar3->nCap = uVar1;
  piVar4 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar3->pArray = piVar4;
  pVVar3->nSize = uVar12;
  memset(piVar4,0xff,(long)(int)uVar12 << 2);
  pHVar2->vTable = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 4000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(16000);
  pVVar3->pArray = piVar4;
  pHVar2->vData = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(4000);
  pVVar3->pArray = piVar4;
  pHVar2->vMap = pVVar3;
  p->pHash = pHVar2;
  pVVar5 = (Vec_Flt_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  pfVar6 = (float *)malloc(4000);
  pVVar5->pArray = pfVar6;
  p->vWeights = pVVar5;
  pVVar7 = p->vCubes;
  if (pVVar7->nSize < 1) {
    if (p->nDivsS != 0) goto LAB_0025ca4c;
    uVar12 = 0;
  }
  else {
    lVar13 = 0;
    lVar14 = 0;
    do {
      Fx_ManCubeSingleCubeDivisors(p,(Vec_Int_t *)((long)&pVVar7->pArray->nCap + lVar13),0,0);
      lVar14 = lVar14 + 1;
      pVVar7 = p->vCubes;
      lVar13 = lVar13 + 0x10;
    } while (lVar14 < pVVar7->nSize);
    pVVar5 = p->vWeights;
    uVar12 = pVVar5->nSize;
    if (p->nDivsS != uVar12) {
LAB_0025ca4c:
      __assert_fail("p->nDivsS == Vec_FltSize(p->vWeights)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                    ,0x373,"void Fx_ManCreateDivisors(Fx_Man_t *)");
    }
    if (0 < pVVar7->nSize) {
      lVar13 = 0;
      lVar14 = 0;
      do {
        lVar14 = lVar14 + 1;
        Fx_ManCubeDoubleCubeDivisors
                  (p,(int)lVar14,(Vec_Int_t *)((long)&pVVar7->pArray->nCap + lVar13),0,0,
                   (int *)((long)&uStack_38 + 4));
        pVVar7 = p->vCubes;
        lVar13 = lVar13 + 0x10;
      } while (lVar14 < pVVar7->nSize);
      pVVar5 = p->vWeights;
      uVar12 = pVVar5->nSize;
    }
  }
  pVVar8 = (Vec_Que_t *)calloc(1,0x20);
  uVar9 = 0x10;
  if (0x10 < (int)uVar12) {
    uVar9 = (ulong)uVar12;
  }
  pVVar8->nSize = 1;
  pVVar8->nCap = (int)uVar9 + 1;
  __size = uVar9 * 4 + 4;
  piVar4 = (int *)malloc(__size);
  memset(piVar4,0xff,__size);
  pVVar8->pHeap = piVar4;
  piVar4 = (int *)malloc(__size);
  memset(piVar4,0xff,__size);
  pVVar8->pOrder = piVar4;
  p->vPrio = pVVar8;
  pVVar8->pCostsFlt = &pVVar5->pArray;
  if (0 < pVVar5->nSize) {
    lVar13 = 0;
    do {
      if (0.0 < pVVar5->pArray[lVar13]) {
        Vec_QuePush(p->vPrio,(int)lVar13);
        pVVar5 = p->vWeights;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Fx_ManCreateDivisors( Fx_Man_t * p )
{
    Vec_Int_t * vCube;
    float Weight;
    int i, fWarning = 0;
    // alloc hash table
    assert( p->pHash == NULL );
    p->pHash = Hsh_VecManStart( 1000 );
    p->vWeights = Vec_FltAlloc( 1000 );
    // create single-cube two-literal divisors
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 0 ); // add - no update
    assert( p->nDivsS == Vec_FltSize(p->vWeights) );
    // create two-cube divisors
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, i+1, vCube, 0, 0, &fWarning ); // add - no update
    // create queue with all divisors
    p->vPrio = Vec_QueAlloc( Vec_FltSize(p->vWeights) );
    Vec_QueSetPriority( p->vPrio, Vec_FltArrayP(p->vWeights) );
    Vec_FltForEachEntry( p->vWeights, Weight, i )
        if ( Weight > 0.0 )
            Vec_QuePush( p->vPrio, i );
}